

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrMesh.cpp
# Opt level: O0

int __thiscall amrex::AmrMesh::GetLevel(AmrMesh *this,Box *domain)

{
  uint uVar1;
  undefined8 uVar2;
  bool bVar3;
  size_type i_00;
  Long LVar4;
  Geometry *this_00;
  Box *this_01;
  int *in_RSI;
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *in_RDI;
  int lev;
  Box ccdomain;
  int i;
  int local_90;
  Box local_8c [2];
  int local_4c;
  Box *local_48;
  int local_3c;
  IndexType *local_38;
  undefined4 local_30;
  int local_2c;
  IntVect *local_28;
  IndexType *local_20;
  int local_14;
  IndexType *local_10;
  int local_4;
  
  local_8c[0].smallend.vect._0_8_ = *(undefined8 *)in_RSI;
  local_8c[0].smallend.vect[2] = in_RSI[2];
  local_8c[0].bigend.vect[0] = in_RSI[3];
  uVar2 = *(undefined8 *)(in_RSI + 4);
  uVar1 = in_RSI[6];
  local_48 = local_8c;
  for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
    local_38 = &local_8c[0].btype;
    local_3c = local_4c;
    local_14 = local_4c;
    local_4 = local_4c;
    if ((uVar1 & 1 << ((byte)local_4c & 0x1f)) != 0) {
      local_28 = &local_8c[0].bigend;
      local_2c = local_4c;
      local_30 = 0xffffffff;
      local_28->vect[local_4c] = local_28->vect[local_4c] + -1;
    }
    local_10 = local_38;
  }
  local_20 = &local_8c[0].btype;
  local_8c[0].btype.itype = 0;
  local_90 = 0;
  local_8c[0].bigend.vect._4_8_ = uVar2;
  while( true ) {
    i_00 = (size_type)local_90;
    LVar4 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::size
                      ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)0x10d5a73);
    if (LVar4 <= (long)i_00) {
      return -1;
    }
    this_00 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[](in_RDI,i_00);
    this_01 = Geometry::Domain(this_00);
    bVar3 = Box::operator==(this_01,local_8c);
    if (bVar3) break;
    local_90 = local_90 + 1;
  }
  return local_90;
}

Assistant:

int
AmrMesh::GetLevel (Box const& domain) noexcept
{
    Box ccdomain = amrex::enclosedCells(domain);
    for (int lev = 0; lev < geom.size(); ++lev) {
        if (geom[lev].Domain() == ccdomain) return lev;
    }
    return -1;
}